

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * google::protobuf::compiler::ruby::PackageToModule
                   (string *__return_storage_ptr__,string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 local_30;
  int i;
  bool next_upper;
  string *name_local;
  string *result;
  
  bVar1 = true;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
        UpperChar(*pcVar3);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PackageToModule(const std::string& name) {
  bool next_upper = true;
  std::string result;
  result.reserve(name.size());

  for (int i = 0; i < name.size(); i++) {
    if (name[i] == '_') {
      next_upper = true;
    } else {
      if (next_upper) {
        result.push_back(UpperChar(name[i]));
      } else {
        result.push_back(name[i]);
      }
      next_upper = false;
    }
  }

  return result;
}